

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O2

iterator __thiscall
iffl::
flat_forward_list<_FILE_FULL_EA_INFORMATION,_iffl::flat_forward_list_traits<_FILE_FULL_EA_INFORMATION>,_std::allocator<_FILE_FULL_EA_INFORMATION>_>
::end(flat_forward_list<_FILE_FULL_EA_INFORMATION,_iffl::flat_forward_list_traits<_FILE_FULL_EA_INFORMATION>,_std::allocator<_FILE_FULL_EA_INFORMATION>_>
      *this)

{
  pointer_type pcVar1;
  buffer_t<char> *in_RSI;
  
  buffer_t<char>::validate(in_RSI);
  pcVar1 = in_RSI->last;
  if (pcVar1 == (pointer_type)0x0) {
    pcVar1 = (pointer_type)0x0;
  }
  else {
    pcVar1 = pcVar1 + ((uint)(byte)pcVar1[5] + (uint)*(ushort *)(pcVar1 + 6) + 0xb & 0x1fffc);
  }
  (this->buffer_).v2_.begin = pcVar1;
  return (iterator)(buffer_char_pointer)this;
}

Assistant:

iterator end() noexcept {
        validate_pointer_invariants();
        if (buff().last) {
            size_with_padding_t const last_element_size{ traits_traits::get_size(buff().last) };
            return iterator{ buff().last + last_element_size.size_padded() };
        } else {
            return iterator{ };
        }
    }